

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageHandler::ShouldIDoCoverage
          (cmCTestCoverageHandler *this,char *file,char *srcDir,char *binDir)

{
  cmCTest *pcVar1;
  bool bVar2;
  __type _Var3;
  pointer this_00;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  cmSystemTools *this_01;
  char *in_R8;
  string local_748 [32];
  undefined1 local_728 [8];
  ostringstream cmCTestLog_msg_2;
  string local_5b0;
  string local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  string local_530;
  undefined1 local_510 [8];
  string relPath;
  string local_4e8 [32];
  undefined1 local_4c8 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_350 [8];
  string ndc;
  string checkDir;
  string fileDir;
  undefined1 local_2e8 [5];
  bool buildSubDir;
  bool sourceSubDir;
  undefined1 local_2c8 [8];
  string fFile;
  string local_2a0;
  undefined1 local_280 [8];
  string fBinDir;
  string local_258;
  undefined1 local_238 [8];
  string fSrcDir;
  ostringstream local_1f8 [8];
  ostringstream cmCTestLog_msg;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_80;
  RegularExpression *local_78;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  local_70;
  iterator sit;
  allocator local_51;
  string local_50;
  char *local_30;
  char *binDir_local;
  char *srcDir_local;
  char *file_local;
  cmCTestCoverageHandler *this_local;
  
  local_30 = binDir;
  binDir_local = srcDir;
  srcDir_local = file;
  file_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,file,&local_51);
  bVar2 = IsFilteredOut(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (bVar2) {
    this_local._7_1_ = 0;
  }
  else {
    __gnu_cxx::
    __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
    ::__normal_iterator(&local_70);
    local_78 = (RegularExpression *)
               std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
               begin(&this->CustomCoverageExcludeRegex);
    local_70._M_current = local_78;
    while( true ) {
      local_80._M_current =
           (RegularExpression *)
           std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                     (&this->CustomCoverageExcludeRegex);
      bVar2 = __gnu_cxx::operator!=(&local_70,&local_80);
      pcVar6 = binDir_local;
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                ::operator->(&local_70);
      bVar2 = cmsys::RegularExpression::find(this_00,srcDir_local);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        poVar8 = std::operator<<((ostream *)local_1f8,"  File ");
        poVar8 = std::operator<<(poVar8,srcDir_local);
        poVar8 = std::operator<<(poVar8," is excluded in CTestCustom.ctest");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0xee,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(fSrcDir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
        this_local._7_1_ = 0;
        goto LAB_004e1bca;
      }
      __gnu_cxx::
      __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
      ::operator++(&local_70);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_258,pcVar6,(allocator *)(fBinDir.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::CollapseFullPath((string *)local_238,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)(fBinDir.field_2._M_local_buf + 0xf));
    pcVar6 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2a0,pcVar6,(allocator *)(fFile.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::CollapseFullPath((string *)local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)(fFile.field_2._M_local_buf + 0xf));
    pcVar6 = srcDir_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2e8,pcVar6,(allocator *)(fileDir.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::CollapseFullPath((string *)local_2c8,(string *)local_2e8);
    std::__cxx11::string::~string((string *)local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)(fileDir.field_2._M_local_buf + 0xf));
    fileDir.field_2._M_local_buf[0xe] =
         cmsys::SystemTools::IsSubDirectory((string *)local_2c8,(string *)local_238);
    fileDir.field_2._M_local_buf[0xd] =
         cmsys::SystemTools::IsSubDirectory((string *)local_2c8,(string *)local_280);
    cmsys::SystemTools::GetFilenamePath((string *)((long)&checkDir.field_2 + 8),(string *)local_2c8)
    ;
    std::__cxx11::string::string((string *)(ndc.field_2._M_local_buf + 8));
    if (((fileDir.field_2._M_local_buf[0xe] & 1U) == 0) ||
       ((fileDir.field_2._M_local_buf[0xd] & 1U) == 0)) {
      if ((fileDir.field_2._M_local_buf[0xe] & 1U) == 0) {
        if ((fileDir.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::operator=
                    ((string *)(ndc.field_2._M_local_buf + 8),(string *)local_280);
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),(string *)local_238);
      }
    }
    else {
      uVar4 = std::__cxx11::string::size();
      uVar5 = std::__cxx11::string::size();
      if (uVar5 < uVar4) {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),(string *)local_238);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),(string *)local_280);
      }
    }
    pcVar6 = (char *)std::__cxx11::string::c_str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
              ((string *)local_350,(cmSystemTools *)".NoDartCoverage",pcVar6,pcVar7,in_R8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
      poVar8 = std::operator<<((ostream *)local_4c8,"Found: ");
      poVar8 = std::operator<<(poVar8,(string *)local_350);
      poVar8 = std::operator<<(poVar8," so skip coverage of ");
      poVar8 = std::operator<<(poVar8,srcDir_local);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x118,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
      this_local._7_1_ = 0;
      relPath.field_2._12_4_ = 1;
    }
    else {
      std::__cxx11::string::string((string *)local_510);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        this_01 = (cmSystemTools *)std::__cxx11::string::c_str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::RelativePath_abi_cxx11_(&local_530,this_01,pcVar6,pcVar7);
        std::__cxx11::string::operator=((string *)local_510,(string *)&local_530);
        std::__cxx11::string::~string((string *)&local_530);
      }
      else {
        std::__cxx11::string::operator=((string *)local_510,(string *)local_2c8);
      }
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&ndc.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_238);
      if (_Var3) {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),(string *)local_280);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(ndc.field_2._M_local_buf + 8),(string *)local_238);
      }
      std::operator+(&local_570,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ndc.field_2 + 8),"/");
      std::operator+(&local_550,&local_570,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510)
      ;
      std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_550);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_570);
      cmsys::SystemTools::GetFilenamePath(&local_590,(string *)local_2c8);
      std::__cxx11::string::operator=((string *)local_2c8,(string *)&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&checkDir.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2c8);
      if (_Var3) {
        this_local._7_1_ = 1;
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::FileExistsInParentDirectories_abi_cxx11_
                  (&local_5b0,(cmSystemTools *)".NoDartCoverage",pcVar6,pcVar7,in_R8);
        std::__cxx11::string::operator=((string *)local_350,(string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_728);
          poVar8 = std::operator<<((ostream *)local_728,"Found: ");
          poVar8 = std::operator<<(poVar8,(string *)local_350);
          poVar8 = std::operator<<(poVar8," so skip coverage of: ");
          poVar8 = std::operator<<(poVar8,srcDir_local);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x13f,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_748);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_728);
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      relPath.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_510);
    }
    std::__cxx11::string::~string((string *)local_350);
    std::__cxx11::string::~string((string *)(ndc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(checkDir.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::~string((string *)local_238);
  }
LAB_004e1bca:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestCoverageHandler::ShouldIDoCoverage(const char* file,
  const char* srcDir,
  const char* binDir)
{
  if(this->IsFilteredOut(file))
    {
    return false;
    }

  std::vector<cmsys::RegularExpression>::iterator sit;
  for ( sit = this->CustomCoverageExcludeRegex.begin();
    sit != this->CustomCoverageExcludeRegex.end(); ++ sit )
    {
    if ( sit->find(file) )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "  File " << file
        << " is excluded in CTestCustom.ctest" << std::endl;, this->Quiet);
      return false;
      }
    }

  std::string fSrcDir = cmSystemTools::CollapseFullPath(srcDir);
  std::string fBinDir = cmSystemTools::CollapseFullPath(binDir);
  std::string fFile = cmSystemTools::CollapseFullPath(file);
  bool sourceSubDir = cmSystemTools::IsSubDirectory(fFile,
    fSrcDir);
  bool buildSubDir = cmSystemTools::IsSubDirectory(fFile,
    fBinDir);
  // Always check parent directory of the file.
  std::string fileDir = cmSystemTools::GetFilenamePath(fFile);
  std::string checkDir;

  // We also need to check the binary/source directory pair.
  if ( sourceSubDir && buildSubDir )
    {
    if ( fSrcDir.size() > fBinDir.size() )
      {
      checkDir = fSrcDir;
      }
    else
      {
      checkDir = fBinDir;
      }
    }
  else if ( sourceSubDir )
    {
    checkDir = fSrcDir;
    }
  else if ( buildSubDir )
    {
    checkDir = fBinDir;
    }
  std::string ndc
    = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage",
      fFile.c_str(), checkDir.c_str());
  if (!ndc.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Found: " << ndc
      << " so skip coverage of " << file << std::endl, this->Quiet);
    return false;
    }

  // By now checkDir should be set to parent directory of the file.
  // Get the relative path to the file an apply it to the opposite directory.
  // If it is the same as fileDir, then ignore, otherwise check.
  std::string relPath;
  if(!checkDir.empty())
    {
    relPath = cmSystemTools::RelativePath(checkDir.c_str(),
                                          fFile.c_str());
    }
  else
    {
    relPath = fFile;
    }
  if ( checkDir == fSrcDir )
    {
    checkDir = fBinDir;
    }
  else
    {
    checkDir = fSrcDir;
    }
  fFile = checkDir + "/" + relPath;
  fFile = cmSystemTools::GetFilenamePath(fFile);

  if ( fileDir == fFile )
    {
    // This is in-source build, so we trust the previous check.
    return true;
    }

  ndc = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage",
    fFile.c_str(), checkDir.c_str());
  if (!ndc.empty())
    {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Found: " << ndc
      << " so skip coverage of: " << file << std::endl, this->Quiet);
    return false;
    }
  // Ok, nothing in source tree, nothing in binary tree
  return true;
}